

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QKmsPlane*>,long_long>
               (reverse_iterator<QKmsPlane_*> first,longlong n,reverse_iterator<QKmsPlane_*> d_first
               )

{
  QKmsPlane *pQVar1;
  long lVar2;
  undefined8 uVar3;
  Data *pDVar4;
  uint *puVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  QKmsPlane *pQVar14;
  QKmsPlane *pQVar15;
  QKmsPlane *pQVar16;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = *d_first.current;
  pQVar15 = local_58.end.current + -n;
  pQVar1 = *first.current;
  pQVar16 = pQVar1;
  pQVar14 = pQVar15;
  if (pQVar15 < pQVar1) {
    pQVar16 = pQVar15;
    pQVar14 = pQVar1;
  }
  pQVar1 = *d_first.current;
  while (pQVar1 != pQVar14) {
    lVar2 = *(long *)first.current;
    pQVar1[-1].possibleCrtcs = *(int *)(lVar2 + -0x60);
    uVar3 = *(undefined8 *)(lVar2 + -0x68);
    pQVar1[-1].id = (int)uVar3;
    pQVar1[-1].type = (int)((ulong)uVar3 >> 0x20);
    pDVar4 = *(Data **)(lVar2 + -0x58);
    *(undefined8 *)(lVar2 + -0x58) = 0;
    pQVar1[-1].supportedFormats.d.d = pDVar4;
    puVar5 = *(uint **)(lVar2 + -0x50);
    *(undefined8 *)(lVar2 + -0x50) = 0;
    pQVar1[-1].supportedFormats.d.ptr = puVar5;
    qVar6 = *(qsizetype *)(lVar2 + -0x48);
    *(undefined8 *)(lVar2 + -0x48) = 0;
    pQVar1[-1].supportedFormats.d.size = qVar6;
    uVar3 = *(undefined8 *)(lVar2 + -0x40);
    uVar7 = *(undefined8 *)(lVar2 + -0x38);
    uVar8 = *(undefined8 *)(lVar2 + -0x30);
    uVar9 = *(undefined8 *)(lVar2 + -0x28);
    uVar10 = *(undefined8 *)(lVar2 + -0x20);
    uVar11 = *(undefined8 *)(lVar2 + -0x18);
    uVar12 = *(undefined8 *)(lVar2 + -0x10);
    uVar13 = *(undefined8 *)(lVar2 + -8);
    pQVar1[-1].initialRotation = (Rotations)(int)uVar3;
    pQVar1[-1].availableRotations = (Rotations)(int)((ulong)uVar3 >> 0x20);
    pQVar1[-1].rotationPropertyId = (int)uVar7;
    pQVar1[-1].crtcPropertyId = (int)((ulong)uVar7 >> 0x20);
    pQVar1[-1].framebufferPropertyId = (int)uVar8;
    pQVar1[-1].srcXPropertyId = (int)((ulong)uVar8 >> 0x20);
    pQVar1[-1].srcYPropertyId = (int)uVar9;
    pQVar1[-1].crtcXPropertyId = (int)((ulong)uVar9 >> 0x20);
    pQVar1[-1].crtcYPropertyId = (int)uVar10;
    pQVar1[-1].srcwidthPropertyId = (int)((ulong)uVar10 >> 0x20);
    pQVar1[-1].srcheightPropertyId = (int)uVar11;
    pQVar1[-1].crtcwidthPropertyId = (int)((ulong)uVar11 >> 0x20);
    pQVar1[-1].crtcheightPropertyId = (int)uVar12;
    pQVar1[-1].zposPropertyId = (int)((ulong)uVar12 >> 0x20);
    pQVar1[-1].blendOpPropertyId = (int)uVar13;
    pQVar1[-1].activeCrtcId = (int)((ulong)uVar13 >> 0x20);
    *(long *)d_first.current = *(long *)d_first.current + -0x68;
    *(long *)first.current = *(long *)first.current + -0x68;
    pQVar1 = *d_first.current;
  }
  local_58.intermediate.current = *d_first.current;
  while (pQVar1 = *d_first.current, pQVar1 != pQVar15) {
    lVar2 = *(long *)first.current;
    pQVar1[-1].possibleCrtcs = *(int *)(lVar2 + -0x60);
    uVar3 = *(undefined8 *)(lVar2 + -0x68);
    pQVar1[-1].id = (int)uVar3;
    pQVar1[-1].type = (int)((ulong)uVar3 >> 0x20);
    QArrayDataPointer<unsigned_int>::operator=
              (&pQVar1[-1].supportedFormats.d,(QArrayDataPointer<unsigned_int> *)(lVar2 + -0x58));
    uVar3 = *(undefined8 *)(lVar2 + -0x40);
    uVar7 = *(undefined8 *)(lVar2 + -0x38);
    uVar8 = *(undefined8 *)(lVar2 + -0x30);
    uVar9 = *(undefined8 *)(lVar2 + -0x28);
    uVar10 = *(undefined8 *)(lVar2 + -0x20);
    uVar11 = *(undefined8 *)(lVar2 + -0x18);
    uVar12 = *(undefined8 *)(lVar2 + -0x10);
    uVar13 = *(undefined8 *)(lVar2 + -8);
    pQVar1[-1].initialRotation = (Rotations)(int)uVar3;
    pQVar1[-1].availableRotations = (Rotations)(int)((ulong)uVar3 >> 0x20);
    pQVar1[-1].rotationPropertyId = (int)uVar7;
    pQVar1[-1].crtcPropertyId = (int)((ulong)uVar7 >> 0x20);
    pQVar1[-1].framebufferPropertyId = (int)uVar8;
    pQVar1[-1].srcXPropertyId = (int)((ulong)uVar8 >> 0x20);
    pQVar1[-1].srcYPropertyId = (int)uVar9;
    pQVar1[-1].crtcXPropertyId = (int)((ulong)uVar9 >> 0x20);
    pQVar1[-1].crtcYPropertyId = (int)uVar10;
    pQVar1[-1].srcwidthPropertyId = (int)((ulong)uVar10 >> 0x20);
    pQVar1[-1].srcheightPropertyId = (int)uVar11;
    pQVar1[-1].crtcwidthPropertyId = (int)((ulong)uVar11 >> 0x20);
    pQVar1[-1].crtcheightPropertyId = (int)uVar12;
    pQVar1[-1].zposPropertyId = (int)((ulong)uVar12 >> 0x20);
    pQVar1[-1].blendOpPropertyId = (int)uVar13;
    pQVar1[-1].activeCrtcId = (int)((ulong)uVar13 >> 0x20);
    *(long *)d_first.current = *(long *)d_first.current + -0x68;
    *(long *)first.current = *(long *)first.current + -0x68;
  }
  local_58.iter = &local_58.end;
  while (pQVar1 = *first.current, pQVar1 != pQVar16) {
    *(QKmsPlane **)first.current = pQVar1 + 1;
    pDVar4 = (pQVar1->supportedFormats).d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pQVar1->supportedFormats).d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QKmsPlane_*>,_long_long>::Destructor::
  ~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}